

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void pop_symbol_scope(Context_conflict *ctx,SymbolMap *map)

{
  SymbolScope *pSVar1;
  char *pcVar2;
  
  pSVar1 = map->scope;
  while( true ) {
    if (pSVar1 == (SymbolScope *)0x0) {
      __assert_fail("map->scope != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x1e8,"void pop_symbol_scope(Context *, SymbolMap *)");
    }
    pcVar2 = pSVar1->symbol;
    pop_symbol(ctx,map);
    if (pcVar2 == (char *)0x0) break;
    pSVar1 = map->scope;
  }
  return;
}

Assistant:

static void pop_symbol_scope(Context *ctx, SymbolMap *map)
{
    while ((map->scope) && (map->scope->symbol))
        pop_symbol(ctx, map);

    assert(map->scope != NULL);
    assert(map->scope->symbol == NULL);
    pop_symbol(ctx, map);
}